

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dothrow.c
# Opt level: O1

boolean breaktest(obj *obj)

{
  boolean bVar1;
  int iVar2;
  
  bVar1 = obj_resists(obj,1,99);
  if (bVar1 == '\0') {
    if ((((*(ushort *)&objects[obj->otyp].field_0x11 & 0x1f0) == 0x130) && (obj->oartifact == '\0'))
       && (obj->oclass != '\r')) {
      return '\x01';
    }
    iVar2 = 0x14f;
    if (obj->oclass != '\b') {
      iVar2 = (int)obj->otyp;
    }
    if ((iVar2 - 0xeaU < 0x37) && ((0x40802000000001U >> ((ulong)(iVar2 - 0xeaU) & 0x3f) & 1) != 0))
    {
      return '\x01';
    }
    if (iVar2 - 0x218U < 2) {
      return '\x01';
    }
    if (iVar2 == 0x14f) {
      return '\x01';
    }
  }
  return '\0';
}

Assistant:

boolean breaktest(struct obj *obj)
{
	if (obj_resists(obj, 1, 99)) return 0;
	if (objects[obj->otyp].oc_material == GLASS && !obj->oartifact &&
		obj->oclass != GEM_CLASS)
	    return 1;
	switch (obj->oclass == POTION_CLASS ? POT_WATER : obj->otyp) {
		case EXPENSIVE_CAMERA:
		case POT_WATER:		/* really, all potions */
		case EGG:
		case CREAM_PIE:
		case MELON:
		case ACID_VENOM:
		case BLINDING_VENOM:
			return 1;
		default:
			return 0;
	}
}